

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_safe.cpp
# Opt level: O0

Error * __thiscall
ot::commissioner::CommissionerSafe::GetActiveDataset
          (Error *__return_storage_ptr__,CommissionerSafe *this,ActiveOperationalDataset *aDataset,
          uint16_t aDatasetFlags)

{
  promise<ot::commissioner::Error> local_90;
  function<void_(const_ot::commissioner::ActiveOperationalDataset_*,_ot::commissioner::Error)>
  local_70;
  undefined1 local_50 [8];
  anon_class_16_2_29584ec1 wait;
  promise<ot::commissioner::Error> pro;
  uint16_t aDatasetFlags_local;
  ActiveOperationalDataset *aDataset_local;
  CommissionerSafe *this_local;
  
  std::promise<ot::commissioner::Error>::promise((promise<ot::commissioner::Error> *)&wait.aDataset)
  ;
  local_50 = (undefined1  [8])&wait.aDataset;
  wait.pro = (promise<ot::commissioner::Error> *)aDataset;
  std::function<void(ot::commissioner::ActiveOperationalDataset_const*,ot::commissioner::Error)>::
  function<ot::commissioner::CommissionerSafe::GetActiveDataset(ot::commissioner::ActiveOperationalDataset&,unsigned_short)::__0&,void>
            ((function<void(ot::commissioner::ActiveOperationalDataset_const*,ot::commissioner::Error)>
              *)&local_70,(anon_class_16_2_29584ec1 *)local_50);
  (*(this->super_Commissioner)._vptr_Commissioner[0x19])(this,&local_70,(ulong)aDatasetFlags);
  std::function<void_(const_ot::commissioner::ActiveOperationalDataset_*,_ot::commissioner::Error)>
  ::~function(&local_70);
  std::promise<ot::commissioner::Error>::get_future(&local_90);
  std::future<ot::commissioner::Error>::get
            (__return_storage_ptr__,(future<ot::commissioner::Error> *)&local_90);
  std::future<ot::commissioner::Error>::~future((future<ot::commissioner::Error> *)&local_90);
  std::promise<ot::commissioner::Error>::~promise
            ((promise<ot::commissioner::Error> *)&wait.aDataset);
  return __return_storage_ptr__;
}

Assistant:

Error CommissionerSafe::GetActiveDataset(ActiveOperationalDataset &aDataset, uint16_t aDatasetFlags)
{
    std::promise<Error> pro;
    auto                wait = [&pro, &aDataset](const ActiveOperationalDataset *dataset, Error error) {
        if (dataset != nullptr)
        {
            aDataset = *dataset;
        }
        pro.set_value(error);
    };

    GetActiveDataset(wait, aDatasetFlags);
    return pro.get_future().get();
}